

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::MethodDescriptor::CopyTo(MethodDescriptor *this,MethodDescriptorProto *proto)

{
  LazyDescriptor *pLVar1;
  string *psVar2;
  MethodOptions *pMVar3;
  MethodOptions *pMVar4;
  string *psVar5;
  string local_40;
  
  psVar5 = *(string **)this;
  (proto->_has_bits_).has_bits_[0] = (proto->_has_bits_).has_bits_[0] | 1;
  psVar2 = (proto->name_).ptr_;
  if (psVar2 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena(&proto->name_,psVar5);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar2);
  }
  pLVar1 = (LazyDescriptor *)(this + 0x18);
  if (*(GoogleOnceDynamic **)(this + 0x28) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::internal::LazyDescriptor>
              (*(GoogleOnceDynamic **)(this + 0x28),internal::LazyDescriptor::OnceStatic,pLVar1);
  }
  if (pLVar1->descriptor_[0x29] == (Descriptor)0x0) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".","");
    internal::ArenaStringPtr::SetNoArena
              (&proto->input_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               &local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 2;
  psVar5 = (proto->input_type_).ptr_;
  if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena
              (&proto->input_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    psVar5 = (proto->input_type_).ptr_;
  }
  if (*(GoogleOnceDynamic **)(this + 0x28) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::internal::LazyDescriptor>
              (*(GoogleOnceDynamic **)(this + 0x28),internal::LazyDescriptor::OnceStatic,pLVar1);
  }
  std::__cxx11::string::_M_append((char *)psVar5,**(ulong **)(*(long *)(this + 0x18) + 8));
  pLVar1 = (LazyDescriptor *)(this + 0x38);
  if (*(GoogleOnceDynamic **)(this + 0x48) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::internal::LazyDescriptor>
              (*(GoogleOnceDynamic **)(this + 0x48),internal::LazyDescriptor::OnceStatic,pLVar1);
  }
  if (pLVar1->descriptor_[0x29] == (Descriptor)0x0) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,".","");
    internal::ArenaStringPtr::SetNoArena
              (&proto->output_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               &local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 4;
  psVar5 = (proto->output_type_).ptr_;
  if (psVar5 == (string *)&internal::fixed_address_empty_string_abi_cxx11_) {
    internal::ArenaStringPtr::CreateInstanceNoArena
              (&proto->output_type_,(string *)&internal::fixed_address_empty_string_abi_cxx11_);
    psVar5 = (proto->output_type_).ptr_;
  }
  if (*(GoogleOnceDynamic **)(this + 0x48) != (GoogleOnceDynamic *)0x0) {
    GoogleOnceDynamic::Init<google::protobuf::internal::LazyDescriptor>
              (*(GoogleOnceDynamic **)(this + 0x48),internal::LazyDescriptor::OnceStatic,pLVar1);
  }
  std::__cxx11::string::_M_append((char *)psVar5,**(ulong **)(*(long *)(this + 0x38) + 8));
  pMVar4 = *(MethodOptions **)(this + 0x58);
  pMVar3 = MethodOptions::default_instance();
  if (pMVar4 != pMVar3) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 8;
    pMVar4 = proto->options_;
    if (pMVar4 == (MethodOptions *)0x0) {
      pMVar4 = (MethodOptions *)operator_new(0x70);
      MethodOptions::MethodOptions(pMVar4);
      proto->options_ = pMVar4;
    }
    MethodOptions::CopyFrom(pMVar4,*(MethodOptions **)(this + 0x58));
  }
  if (this[0x60] == (MethodDescriptor)0x1) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 0x10;
    proto->client_streaming_ = true;
  }
  if (this[0x61] == (MethodDescriptor)0x1) {
    *(byte *)(proto->_has_bits_).has_bits_ = (byte)(proto->_has_bits_).has_bits_[0] | 0x20;
    proto->server_streaming_ = true;
  }
  return;
}

Assistant:

void MethodDescriptor::CopyTo(MethodDescriptorProto* proto) const {
  proto->set_name(name());

  if (!input_type()->is_unqualified_placeholder_) {
    proto->set_input_type(".");
  }
  proto->mutable_input_type()->append(input_type()->full_name());

  if (!output_type()->is_unqualified_placeholder_) {
    proto->set_output_type(".");
  }
  proto->mutable_output_type()->append(output_type()->full_name());

  if (&options() != &MethodOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }

  if (client_streaming_) {
    proto->set_client_streaming(true);
  }
  if (server_streaming_) {
    proto->set_server_streaming(true);
  }
}